

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

void __thiscall
CLI::App::_parse_subcommand
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer puVar1;
  App *this_00;
  bool bVar2;
  size_t sVar3;
  __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_> _Var4;
  HorribleError *this_01;
  pointer puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  sVar3 = _count_remaining_positionals(this,true);
  if (sVar3 != 0) {
    _parse_positional(this,args);
    return;
  }
  puVar5 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar5 == puVar1) {
      if (this->parent_ != (App *)0x0) {
        _parse_subcommand(this->parent_,args);
        return;
      }
      this_01 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_90,"Subcommand ",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1);
      ::std::operator+(&local_70,&local_90," missing");
      HorribleError::HorribleError(this_01,&local_70);
      __cxa_throw(this_01,&HorribleError::typeinfo,Error::~Error);
    }
    this_00 = (puVar5->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
              super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
              super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
    ::std::__cxx11::string::string
              ((string *)&local_50,
               (string *)
               ((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish + -1));
    bVar2 = check_name(this_00,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) break;
    puVar5 = puVar5 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(args);
  local_90._M_dataplus._M_p =
       (pointer)(puVar5->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
  _Var4 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<CLI::App**,std::vector<CLI::App*,std::allocator<CLI::App*>>>,__gnu_cxx::__ops::_Iter_equals_val<CLI::App*const>>
                    ((this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var4._M_current ==
      (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_90._M_dataplus._M_p =
         (pointer)(puVar5->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>.
                  _M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                  super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
    ::std::vector<CLI::App*,std::allocator<CLI::App*>>::emplace_back<CLI::App*>
              ((vector<CLI::App*,std::allocator<CLI::App*>> *)&this->parsed_subcommands_,
               (App **)&local_90);
  }
  _parse((puVar5->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
         super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
         super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl,args);
  return;
}

Assistant:

void _parse_subcommand(std::vector<std::string> &args) {
        if(_count_remaining_positionals(/* required */ true) > 0)
            return _parse_positional(args);
        for(const App_p &com : subcommands_) {
            if(com->check_name(args.back())) {
                args.pop_back();
                if(std::find(std::begin(parsed_subcommands_), std::end(parsed_subcommands_), com.get()) ==
                   std::end(parsed_subcommands_))
                    parsed_subcommands_.push_back(com.get());
                com->_parse(args);
                return;
            }
        }
        if(parent_ != nullptr)
            return parent_->_parse_subcommand(args);
        else
            throw HorribleError("Subcommand " + args.back() + " missing");
    }